

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O1

bool __thiscall GoState<9U,_9U>::is_eye(GoState<9U,_9U> *this,int i,int j,int player)

{
  bool bVar1;
  
  if (i < 1) {
    bVar1 = true;
  }
  else {
    bVar1 = (uint)this->board[i - 1][j] == player;
  }
  if (((uint)i < 8) && ((uint)this->board[i + 1][j] != player)) {
    bVar1 = false;
  }
  if (0 < j) {
    if ((uint)this->board[i][j - 1] != player) {
      bVar1 = false;
    }
  }
  if (((uint)j < 8) && ((uint)this->board[i][(ulong)(uint)j + 1] != player)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

virtual bool is_eye(int i, int j, int player) const
	{
		bool eye = true;
		if (i > 0 && board[i - 1][j] != player) eye = false;
		if (i < M - 1 && board[i + 1][j] != player) eye = false;
		if (j > 0 && board[i][j - 1] != player) eye = false;
		if (j < N - 1 && board[i][j + 1] != player) eye = false;
		return eye;
	}